

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-default-loop-close.c
# Opt level: O3

int run_test_default_loop_close(void)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  uv_timer_t timer_handle;
  undefined1 local_a0 [152];
  
  lVar2 = uv_default_loop();
  if (lVar2 == 0) {
    run_test_default_loop_close_cold_13();
LAB_0014dba6:
    run_test_default_loop_close_cold_1();
LAB_0014dbab:
    run_test_default_loop_close_cold_2();
LAB_0014dbb0:
    run_test_default_loop_close_cold_3();
LAB_0014dbb5:
    run_test_default_loop_close_cold_4();
LAB_0014dbba:
    run_test_default_loop_close_cold_5();
LAB_0014dbbf:
    run_test_default_loop_close_cold_12();
LAB_0014dbc4:
    run_test_default_loop_close_cold_6();
LAB_0014dbc9:
    run_test_default_loop_close_cold_7();
LAB_0014dbce:
    run_test_default_loop_close_cold_8();
LAB_0014dbd3:
    run_test_default_loop_close_cold_9();
  }
  else {
    iVar1 = uv_timer_init(lVar2,local_a0);
    if (iVar1 != 0) goto LAB_0014dba6;
    iVar1 = uv_timer_start(local_a0,timer_cb,1,0);
    if (iVar1 != 0) goto LAB_0014dbab;
    iVar1 = uv_run(lVar2,0);
    if (iVar1 != 0) goto LAB_0014dbb0;
    if (timer_cb_called != 1) goto LAB_0014dbb5;
    iVar1 = uv_loop_close(lVar2);
    if (iVar1 != 0) goto LAB_0014dbba;
    lVar2 = uv_default_loop();
    if (lVar2 == 0) goto LAB_0014dbbf;
    iVar1 = uv_timer_init(lVar2,local_a0);
    if (iVar1 != 0) goto LAB_0014dbc4;
    iVar1 = uv_timer_start(local_a0,timer_cb,1,0);
    if (iVar1 != 0) goto LAB_0014dbc9;
    iVar1 = uv_run(lVar2,0);
    if (iVar1 != 0) goto LAB_0014dbce;
    if (timer_cb_called != 2) goto LAB_0014dbd3;
    iVar1 = uv_loop_close(lVar2);
    if (iVar1 == 0) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0014dbdd;
    }
  }
  run_test_default_loop_close_cold_10();
LAB_0014dbdd:
  run_test_default_loop_close_cold_11();
  timer_cb_called = timer_cb_called + 1;
  iVar1 = uv_close();
  return iVar1;
}

Assistant:

TEST_IMPL(default_loop_close) {
  uv_loop_t* loop;
  uv_timer_t timer_handle;

  loop = uv_default_loop();
  ASSERT(loop != NULL);

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 1, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == timer_cb_called);
  ASSERT(0 == uv_loop_close(loop));

  loop = uv_default_loop();
  ASSERT(loop != NULL);

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 1, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(2 == timer_cb_called);
  ASSERT(0 == uv_loop_close(loop));

  MAKE_VALGRIND_HAPPY();
  return 0;
}